

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

int32_t u_strncmp_63(UChar *s1,UChar *s2,int32_t n)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (n < 1) {
    return 0;
  }
  iVar1 = (uint)(ushort)*s1 - (uint)(ushort)*s2;
  if ((n != 1 && *s1 != L'\0') && iVar1 == 0) {
    lVar3 = 0;
    do {
      iVar1 = (uint)(ushort)s1[lVar3 + 1] - (uint)(ushort)s2[lVar3 + 1];
      if (s1[lVar3 + 1] == L'\0') {
        return iVar1;
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar2 = (int)lVar3;
      iVar1 = 0;
      lVar3 = lVar3 + 1;
    } while (n + -2 != iVar2);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t   U_EXPORT2
u_strncmp(const UChar     *s1, 
     const UChar     *s2, 
     int32_t     n) 
{
    if(n > 0) {
        int32_t rc;
        for(;;) {
            rc = (int32_t)*s1 - (int32_t)*s2;
            if(rc != 0 || *s1 == 0 || --n == 0) {
                return rc;
            }
            ++s1;
            ++s2;
        }
    } else {
        return 0;
    }
}